

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  
  Align(this,other);
  iVar2 = this->exponent_;
  iVar5 = this->used_digits_ + iVar2;
  iVar7 = other->used_digits_ + other->exponent_;
  if (iVar7 < iVar5) {
    iVar7 = iVar5;
  }
  if ((iVar7 - iVar2) + 1 < 0x81) {
    iVar2 = other->exponent_ - iVar2;
    if (other->used_digits_ < 1) {
      uVar3 = 0;
    }
    else {
      puVar6 = (other->bigits_).start_;
      puVar1 = (this->bigits_).start_;
      lVar8 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 + puVar1[iVar2 + lVar8] + puVar6[lVar8];
        puVar1[iVar2 + lVar8] = uVar3 & 0xfffffff;
        uVar3 = uVar3 >> 0x1c;
        lVar8 = lVar8 + 1;
      } while (lVar8 < other->used_digits_);
      iVar2 = iVar2 + (int)lVar8;
    }
    if (uVar3 != 0) {
      puVar6 = (this->bigits_).start_ + iVar2;
      do {
        uVar4 = uVar3 + *puVar6;
        *puVar6 = uVar4 & 0xfffffff;
        uVar3 = uVar4 >> 0x1c;
        puVar6 = puVar6 + 1;
        iVar2 = iVar2 + 1;
      } while (0xfffffff < uVar4);
    }
    iVar7 = this->used_digits_;
    if (this->used_digits_ < iVar2) {
      iVar7 = iVar2;
    }
    this->used_digits_ = iVar7;
    return;
  }
  abort();
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + Max(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  ASSERT(bigit_pos >= 0);
  for (int i = 0; i < other.used_digits_; ++i) {
    Chunk sum = bigits_[bigit_pos] + other.bigits_[i] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }

  while (carry != 0) {
    Chunk sum = bigits_[bigit_pos] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }
  used_digits_ = Max(bigit_pos, used_digits_);
  ASSERT(IsClamped());
}